

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microtar.c
# Opt level: O2

int mtar_find(mtar_t *tar,char *name,mtar_header_t *h)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  mtar_header_t header;
  
  sVar3 = strlen(name);
  if (sVar3 < 100) {
    tar->remaining_data = 0;
    tar->last_header = 0;
    iVar1 = (*tar->seek)(tar,0);
    tar->pos = 0;
    if (iVar1 == 0) {
      while (iVar2 = mtar_read_header(tar,&header), iVar2 == 0) {
        iVar1 = strcmp(header.name,name);
        if (iVar1 == 0) {
          if (h == (mtar_header_t *)0x0) {
            return 0;
          }
          memcpy(h,&header,0xe0);
          return 0;
        }
        mtar_next(tar);
      }
      iVar1 = -8;
      if (iVar2 != -7) {
        iVar1 = iVar2;
      }
    }
  }
  else {
    iVar1 = -9;
  }
  return iVar1;
}

Assistant:

int mtar_find(mtar_t *tar, const char *name, mtar_header_t *h) {
  int err;
  mtar_header_t header;

  if (strlen(name) > MTAR_NAMEMAX)
    return MTAR_ENAMELONG;

  /* Start at beginning */
  err = mtar_rewind(tar);
  if (err) {
    return err;
  }
  /* Iterate all files until we hit an error or find the file */
  while ( (err = mtar_read_header(tar, &header)) == MTAR_ESUCCESS ) {
    if ( !strcmp(header.name, name) ) {
      if (h) {
        *h = header;
      }
      return MTAR_ESUCCESS;
    }
    mtar_next(tar);
  }
  /* Return error */
  if (err == MTAR_ENULLRECORD) {
    err = MTAR_ENOTFOUND;
  }
  return err;
}